

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetectorTest.cpp
# Opt level: O2

void __thiscall
TEST_SimpleStringBuffer_resetWriteLimit_Test::testBody
          (TEST_SimpleStringBuffer_resetWriteLimit_Test *this)

{
  char *pcVar1;
  UtestShell *pUVar2;
  char *pcVar3;
  TestTerminator *pTVar4;
  int iVar5;
  bool bVar6;
  SimpleString str;
  SimpleStringBuffer buffer;
  
  SimpleStringBuffer::SimpleStringBuffer(&buffer);
  SimpleStringBuffer::setWriteLimit(&buffer,10);
  iVar5 = 0x1000;
  while (bVar6 = iVar5 != 0, iVar5 = iVar5 + -1, bVar6) {
    SimpleStringBuffer::add(&buffer,"h");
  }
  SimpleStringBuffer::resetWriteLimit(&buffer);
  SimpleString::SimpleString(&str,"h",10);
  pcVar1 = SimpleString::asCharString(&str);
  SimpleStringBuffer::add(&buffer,"%s",pcVar1);
  SimpleString::~SimpleString(&str);
  SimpleString::SimpleString(&str,"h",0x14);
  pUVar2 = UtestShell::getCurrent();
  pcVar1 = SimpleString::asCharString(&str);
  pcVar3 = SimpleStringBuffer::toString(&buffer);
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[9])
            (pUVar2,pcVar1,pcVar3,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakDetectorTest.cpp"
             ,0x26d,pTVar4);
  SimpleString::~SimpleString(&str);
  return;
}

Assistant:

TEST(SimpleStringBuffer, resetWriteLimit)
{
    SimpleStringBuffer buffer;
    buffer.setWriteLimit(10);
    for (int i = 0; i < SimpleStringBuffer::SIMPLE_STRING_BUFFER_LEN ; i++)
        buffer.add("h");
    buffer.resetWriteLimit();
    buffer.add("%s", SimpleString("h", 10).asCharString());

    SimpleString str("h", 20);
    STRCMP_EQUAL(str.asCharString(), buffer.toString());
}